

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O1

uchar rule_p2_p3(BidiType *types,size_t size)

{
  BidiType BVar1;
  bool bVar2;
  bool bVar3;
  uchar in_AL;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  
  if (size == 0) {
    return '\0';
  }
  sVar5 = 0;
  do {
    BVar1 = types[sVar5];
    if ((0x908U >> (BVar1 & (CS|AN)) & 1) == 0) {
      if ((1 << ((byte)BVar1 & 0x1f) & 0x31U) == 0) {
        bVar3 = true;
      }
      else {
        in_AL = BVar1 != L;
        bVar3 = false;
      }
    }
    else {
      sVar4 = sVar5 + 1;
      iVar7 = 1;
      sVar6 = sVar4;
      do {
        bVar3 = true;
        sVar5 = size;
        if (size <= sVar6) break;
        if ((0x908U >> (types[sVar6] & (CS|AN)) & 1) == 0) {
          bVar2 = true;
          if ((types[sVar6] == PDI) && (iVar7 = iVar7 + -1, iVar7 == 0)) {
            iVar7 = 0;
            bVar2 = false;
            sVar4 = sVar6;
          }
        }
        else {
          iVar7 = iVar7 + 1;
          bVar2 = true;
        }
        sVar6 = sVar6 + 1;
        sVar5 = sVar4;
      } while (bVar2);
    }
    if (!bVar3) {
      return in_AL;
    }
    sVar5 = sVar5 + 1;
    if (size <= sVar5) {
      return '\0';
    }
  } while( true );
}

Assistant:

static unsigned char rule_p2_p3(const BidiType *types, size_t size)
{
    /*
     * Rule P2. Find the first strong type (L, R or AL), ignoring
     * anything inside an isolated segment.
     *
     * Rule P3. If that type is R or AL, choose a paragraph embeddding
     * level of 1, otherwise 0.
     */
    for (size_t i = 0; i < size; i++) {
        BidiType t = types[i];
        if (typeIsIsolateInitiator(t))
            i = find_matching_pdi(types, i, size);
        else if (typeIsStrong(t))
            return (t == L ? 0 : 1);
    }

    return 0; /* default if no strong type found */
}